

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

void Abc_NtkCollectHie_rec(Abc_Ntk_t *pNtk,Vec_Ptr_t *vModels)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vOrder;
  Vec_Ptr_t *vModels_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->iStep < 0) {
    p = Abc_NtkDfsBoxes(pNtk);
    for (local_2c = 0; iVar1 = Vec_PtrSize(p), local_2c < iVar1; local_2c = local_2c + 1) {
      pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(p,local_2c);
      iVar1 = Abc_ObjIsBox(pObj_00);
      if ((iVar1 != 0) && ((Abc_Ntk_t *)(pObj_00->field_5).pData != pNtk)) {
        Abc_NtkCollectHie_rec((Abc_Ntk_t *)(pObj_00->field_5).pData,vModels);
      }
    }
    Vec_PtrFree(p);
    iVar1 = Vec_PtrSize(vModels);
    pNtk->iStep = iVar1;
    Vec_PtrPush(vModels,pNtk);
  }
  return;
}

Assistant:

void Abc_NtkCollectHie_rec( Abc_Ntk_t * pNtk, Vec_Ptr_t * vModels )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pObj;
    int i;
    if ( pNtk->iStep >= 0 )
        return;
    vOrder = Abc_NtkDfsBoxes( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        if ( Abc_ObjIsBox(pObj) && (Abc_Ntk_t *)pObj->pData != pNtk )
            Abc_NtkCollectHie_rec( (Abc_Ntk_t *)pObj->pData, vModels );
    Vec_PtrFree( vOrder );
    pNtk->iStep = Vec_PtrSize(vModels);
    Vec_PtrPush( vModels, pNtk );
}